

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concavity.cpp
# Opt level: O1

float __thiscall ConvexDecomposition::CTri::getVolume(CTri *this,ConvexDecompInterface *callback)

{
  uint uVar1;
  long lVar2;
  float fVar3;
  uint indices [24];
  int aiStack_90 [28];
  
  aiStack_90[2] = 0;
  aiStack_90[3] = 1;
  aiStack_90[4] = 2;
  aiStack_90[5] = 3;
  aiStack_90[6] = 4;
  aiStack_90[7] = 5;
  aiStack_90[8] = 0;
  aiStack_90[9] = 3;
  aiStack_90[10] = 4;
  aiStack_90[0xb] = 0;
  aiStack_90[0xc] = 4;
  aiStack_90[0xd] = 1;
  aiStack_90[0xe] = 1;
  aiStack_90[0xf] = 4;
  aiStack_90[0x10] = 5;
  aiStack_90[0x11] = 1;
  aiStack_90[0x12] = 5;
  aiStack_90[0x13] = 2;
  aiStack_90[0x14] = 0;
  aiStack_90[0x15] = 3;
  aiStack_90[0x16] = 5;
  aiStack_90[0x17] = 0;
  aiStack_90[0x18] = 5;
  aiStack_90[0x19] = 2;
  if (callback != (ConvexDecompInterface *)0x0) {
    lVar2 = 8;
    aiStack_90[0] = 0x9353f0;
    aiStack_90[1] = 0;
    uVar1 = getDebugColor();
    do {
      aiStack_90[0] = 0x935421;
      aiStack_90[1] = 0;
      (*callback->_vptr_ConvexDecompInterface[2])
                (callback,&(this->mP1).x + (uint)(*(int *)((long)aiStack_90 + lVar2) * 3),
                 &(this->mP1).x + (uint)(*(int *)((long)aiStack_90 + lVar2 + 4) * 3),
                 &(this->mP1).x + (uint)(*(int *)((long)aiStack_90 + lVar2 + 8) * 3),(ulong)uVar1);
      lVar2 = lVar2 + 0xc;
    } while (lVar2 != 0x68);
  }
  aiStack_90[0] = 0x93543e;
  aiStack_90[1] = 0;
  fVar3 = computeMeshVolume((float *)this,8,(uint *)(aiStack_90 + 2));
  return fVar3;
}

Assistant:

float getVolume(ConvexDecompInterface *callback) const
	{
		unsigned int indices[8*3];


    unsigned int tcount = 0;

    addTri(indices,0,1,2,tcount);
    addTri(indices,3,4,5,tcount);

    addTri(indices,0,3,4,tcount);
    addTri(indices,0,4,1,tcount);

    addTri(indices,1,4,5,tcount);
    addTri(indices,1,5,2,tcount);

    addTri(indices,0,3,5,tcount);
    addTri(indices,0,5,2,tcount);

    const float *vertices = mP1.Ptr();

		if ( callback )
		{
			unsigned int color = getDebugColor();

#if 0
  		Vector3d d1 = mNear1;
  		Vector3d d2 = mNear2;
	  	Vector3d d3 = mNear3;

  		callback->ConvexDebugPoint(mP1.Ptr(),0.01f,0x00FF00);
  		callback->ConvexDebugPoint(mP2.Ptr(),0.01f,0x00FF00);
  		callback->ConvexDebugPoint(mP3.Ptr(),0.01f,0x00FF00);
  		callback->ConvexDebugPoint(d1.Ptr(),0.01f,0xFF0000);
  		callback->ConvexDebugPoint(d2.Ptr(),0.01f,0xFF0000);
  		callback->ConvexDebugPoint(d3.Ptr(),0.01f,0xFF0000);

  		callback->ConvexDebugTri(mP1.Ptr(), d1.Ptr(),  d1.Ptr(),0x00FF00);
  		callback->ConvexDebugTri(mP2.Ptr(), d2.Ptr(),  d2.Ptr(),0x00FF00);
  		callback->ConvexDebugTri(mP3.Ptr(), d3.Ptr(),  d3.Ptr(),0x00FF00);

#else
			for (unsigned int i=0; i<tcount; i++)
			{
				unsigned int i1 = indices[i*3+0];
				unsigned int i2 = indices[i*3+1];
				unsigned int i3 = indices[i*3+2];

				const float *p1 = &vertices[ i1*3 ];
				const float *p2 = &vertices[ i2*3 ];
				const float *p3 = &vertices[ i3*3 ];

				callback->ConvexDebugTri(p1,p2,p3,color);

			}
#endif
		}

		float v = computeMeshVolume(mP1.Ptr(), tcount, indices );

		return v;

	}